

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDTypes.cpp
# Opt level: O1

bool __thiscall SWDParser::IsLineReset(SWDParser *this,SWDLineReset *reset)

{
  vector<SWDBit,_std::allocator<SWDBit>_> *this_00;
  pointer *ppSVar1;
  pointer pSVar2;
  iterator iVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  SWDBit local_98;
  SWDLineReset *local_68;
  ulong local_60;
  SWDBit local_58;
  
  pSVar2 = (reset->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((reset->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar2) {
    (reset->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar2;
  }
  this_00 = &this->mBitsBuffer;
  lVar5 = 0;
  uVar7 = 0;
  uVar6 = 0;
  local_68 = reset;
  while( true ) {
    if ((ulong)(((long)(this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) <=
        uVar6) {
      local_60 = uVar7;
      ParseBit(&local_98,this);
      iVar3._M_current =
           (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SWDBit,_std::allocator<SWDBit>_>::_M_realloc_insert<SWDBit>
                  (this_00,iVar3,&local_98);
        uVar7 = local_60;
      }
      else {
        (iVar3._M_current)->low_end = local_98.low_end;
        (iVar3._M_current)->rising = local_98.rising;
        (iVar3._M_current)->falling = local_98.falling;
        (iVar3._M_current)->state_rising = local_98.state_rising;
        (iVar3._M_current)->state_falling = local_98.state_falling;
        (iVar3._M_current)->low_start = local_98.low_start;
        ppSVar1 = &(this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
        uVar7 = local_60;
      }
    }
    if (*(int *)((long)&((this_00->super__Vector_base<SWDBit,_std::allocator<SWDBit>_>)._M_impl.
                         super__Vector_impl_data._M_start)->state_rising + lVar5) != 1) break;
    bVar8 = 0x30 < uVar6;
    uVar6 = uVar6 + 1;
    uVar7 = CONCAT71((int7)(uVar7 >> 8),bVar8);
    lVar5 = lVar5 + 0x28;
    if (uVar6 == 0x32) {
LAB_0010b01a:
      ParseBit(&local_58,this);
      local_98.low_end = local_58.low_end;
      local_98.rising = local_58.rising;
      local_98.falling = local_58.falling;
      local_98.state_rising = local_58.state_rising;
      local_98.state_falling = local_58.state_falling;
      uVar4 = local_98._0_8_;
      local_98.low_start = local_58.low_start;
      local_98.state_rising = local_58.state_rising;
      bVar8 = local_98.state_rising == BIT_HIGH;
      local_98._0_8_ = uVar4;
      if (bVar8) {
        do {
          iVar3._M_current =
               (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<SWDBit,std::allocator<SWDBit>>::_M_realloc_insert<SWDBit_const&>
                      ((vector<SWDBit,std::allocator<SWDBit>> *)this_00,iVar3,&local_98);
          }
          else {
            (iVar3._M_current)->low_end = local_58.low_end;
            (iVar3._M_current)->rising = local_58.rising;
            (iVar3._M_current)->falling = local_58.falling;
            (iVar3._M_current)->state_rising = local_58.state_rising;
            (iVar3._M_current)->state_falling = local_58.state_falling;
            (iVar3._M_current)->low_start = local_58.low_start;
            ppSVar1 = &(this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + 1;
          }
          ParseBit(&local_58,this);
          local_98.low_end = local_58.low_end;
          local_98.rising = local_58.rising;
          local_98.falling = local_58.falling;
          local_98.state_rising = local_58.state_rising;
          local_98.state_falling = local_58.state_falling;
          uVar4 = local_98._0_8_;
          local_98.low_start = local_58.low_start;
          local_98.state_rising = local_58.state_rising;
          bVar8 = local_98.state_rising == BIT_HIGH;
          local_98._0_8_ = uVar4;
        } while (bVar8);
      }
      std::vector<SWDBit,_std::allocator<SWDBit>_>::operator=(&local_68->bits,this_00);
      pSVar2 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
          super__Vector_impl_data._M_finish != pSVar2) {
        (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
        super__Vector_impl_data._M_finish = pSVar2;
      }
      iVar3._M_current =
           (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SWDBit,std::allocator<SWDBit>>::_M_realloc_insert<SWDBit_const&>
                  ((vector<SWDBit,std::allocator<SWDBit>> *)this_00,iVar3,&local_98);
      }
      else {
        (iVar3._M_current)->low_end = local_98.low_end;
        (iVar3._M_current)->rising = local_98.rising;
        (iVar3._M_current)->falling = local_98.falling;
        (iVar3._M_current)->state_rising = local_98.state_rising;
        (iVar3._M_current)->state_falling = local_98.state_falling;
        (iVar3._M_current)->low_start = local_98.low_start;
        ppSVar1 = &(this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
LAB_0010b107:
      return (bool)((byte)uVar7 & 1);
    }
  }
  if ((uVar7 & 1) == 0) goto LAB_0010b107;
  goto LAB_0010b01a;
}

Assistant:

bool SWDParser::IsLineReset( SWDLineReset& reset )
{
    reset.Clear();

    // we need at least 50 bits with a value of 1
    for( size_t cnt = 0; cnt < 50; cnt++ )
    {
        if( cnt >= mBitsBuffer.size() )
            mBitsBuffer.push_back( ParseBit() );

        // we can't have a low bit
        if( !mBitsBuffer[ cnt ].IsHigh() )
            return false;
    }

    SWDBit bit;
    while( true )
    {
        bit = ParseBit();
        if( !bit.IsHigh() )
            break;

        mBitsBuffer.push_back( bit );
    }

    // give the bits to the reset object
    reset.bits = mBitsBuffer;
    mBitsBuffer.clear();

    // keep the high bit because that one is probably next operation's start bit
    mBitsBuffer.push_back( bit );

    return true;
}